

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromPackedBuf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string struct_type;
  string struct_var;
  
  (*(this->namer_).super_Namer._vptr_Namer[7])(&struct_var,&this->namer_,struct_def);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&struct_type,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_a0,this,1);
  std::operator+(&local_80,&local_a0,"@classmethod");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_a0,this,1);
  std::operator+(&local_80,&local_a0,"def InitFromPackedBuf(cls, buf, pos=0):");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_80,&local_a0,
                 "n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, pos)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_80,&local_a0,"return cls.InitFromBuf(buf, pos+n)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&struct_type);
  std::__cxx11::string::~string((string *)&struct_var);
  return;
}

Assistant:

void InitializeFromPackedBuf(const StructDef &struct_def,
                               std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_type = namer_.Type(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromPackedBuf(cls, buf, pos=0):";
    code += GenIndents(2) +
            "n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, pos)";
    code += GenIndents(2) + "return cls.InitFromBuf(buf, pos+n)";
    code += "\n";
  }